

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

int glu::TextureTestUtil::computeTextureCompareDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture2DView *src,float *texCoord,
              ReferenceParams *sampleParams,TexComparePrecision *comparePrec,LodPrecision *lodPrec,
              Vec3 *nonShadowThreshold)

{
  undefined8 uVar1;
  ulong uVar2;
  ReferenceParams *pRVar3;
  bool bVar4;
  int i;
  long lVar5;
  int iVar6;
  ConstPixelBufferAccess *pCVar7;
  int iVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  uint uVar37;
  float fVar38;
  uint uVar40;
  float fVar41;
  undefined1 auVar39 [16];
  float fVar42;
  float fVar43;
  Vector<float,_3> res_1;
  Vec2 lodO;
  Vec2 lodBounds;
  Vec3 triT [2];
  Vec4 resPix;
  Vec3 triS [2];
  Vec2 clampedLod;
  Vec4 refPix;
  int local_2bc;
  Vec2 local_2b8;
  float local_2b0;
  float local_2ac;
  ulong local_2a8;
  ConstPixelBufferAccess *local_2a0;
  float local_298;
  float local_294;
  Vec2 local_290;
  undefined4 local_288;
  ReferenceParams *local_280;
  undefined8 local_278;
  undefined4 local_270;
  ulong local_268;
  int local_260;
  float local_25c;
  float local_258;
  float fStack_254;
  undefined8 uStack_250;
  undefined1 local_248 [16];
  float local_238 [6];
  PixelBufferAccess *local_220;
  undefined1 local_218 [36];
  float local_1f4;
  tcu local_1e8 [8];
  float local_1e0;
  undefined1 local_1d8 [8];
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [16];
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  Sampler *local_140;
  Texture2DView *local_138;
  ConstPixelBufferAccess *local_130;
  float local_128;
  float fStack_124;
  float afStack_120 [2];
  undefined8 local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58 [10];
  undefined1 auVar22 [16];
  
  local_218._16_4_ = *texCoord;
  local_238[0] = texCoord[1];
  local_218._20_4_ = texCoord[2];
  local_218._24_4_ = texCoord[4];
  local_218._28_4_ = texCoord[6];
  local_238[1] = texCoord[3];
  local_238[2] = texCoord[5];
  local_238[3] = texCoord[7];
  if (src->m_numLevels < 1) {
    local_258 = 0.0;
    fStack_254 = 0.0;
  }
  else {
    uVar1 = *(undefined8 *)(src->m_levels->m_size).m_data;
    local_258 = (float)(int)uVar1;
    fStack_254 = (float)(int)((ulong)uVar1 >> 0x20);
  }
  uStack_250 = 0;
  local_2ac = (float)(result->m_size).m_data[0];
  fVar28 = (float)(result->m_size).m_data[1];
  local_128 = (sampleParams->super_RenderParams).w.m_data[0];
  fStack_124 = (sampleParams->super_RenderParams).w.m_data[1];
  afStack_120[0] = (sampleParams->super_RenderParams).w.m_data[2];
  afStack_120[1] = (sampleParams->super_RenderParams).w.m_data[3];
  local_118 = CONCAT44(fStack_124,afStack_120[0]);
  _local_1d8 = ZEXT816(0);
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    _local_1d8 = ZEXT416((uint)(sampleParams->super_RenderParams).bias);
  }
  local_58[0] = -1.0;
  local_58[1] = 0.0;
  local_58[2] = 1.0;
  local_58[3] = 0.0;
  local_58[4] = 0.0;
  local_58[5] = -1.0;
  local_58[6] = 0.0;
  local_58[7] = 1.0;
  local_1c8._0_4_ = -1.7146522e+38;
  local_2a0 = result;
  local_280 = sampleParams;
  local_238[4] = local_238[2];
  local_238[5] = local_238[1];
  local_218._32_4_ = local_218._24_4_;
  local_1f4 = (float)local_218._20_4_;
  local_130 = reference;
  tcu::RGBA::toVec((RGBA *)local_1c8);
  tcu::clear(errorMask,(Vec4 *)local_218);
  iVar8 = (local_2a0->m_size).m_data[1];
  if (iVar8 < 1) {
    local_2a8 = 0;
  }
  else {
    local_140 = &local_280->sampler;
    iVar6 = (local_2a0->m_size).m_data[0];
    local_1d8._4_4_ = local_1d8._0_4_;
    uStack_1d0 = local_1d8._0_4_;
    uStack_1cc = local_1d8._0_4_;
    local_f8._4_4_ = fStack_254;
    local_f8._0_4_ = fStack_254;
    local_f8._8_4_ = fStack_254;
    local_f8._12_4_ = fStack_254;
    local_2a8 = 0;
    local_2bc = 0;
    pCVar7 = local_2a0;
    local_220 = errorMask;
    local_138 = src;
    do {
      if (0 < iVar6) {
        local_2b0 = (float)local_2bc + 0.5;
        local_25c = fVar28 - local_2b0;
        local_108 = ZEXT416((uint)(local_2b0 / fVar28));
        local_e8 = ZEXT416((uint)(1.0 - local_2b0 / fVar28));
        iVar8 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_218,(int)pCVar7,iVar8,local_2bc);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_1c8,(int)local_130,iVar8,local_2bc);
          local_268 = local_1c8._4_8_;
          local_260 = local_1c8._12_4_;
          local_1e8[0] = (tcu)local_218[4];
          local_1e8[1] = (tcu)local_218[5];
          local_1e8[2] = (tcu)local_218[6];
          local_1e8[3] = (tcu)local_218[7];
          local_1e8[4] = (tcu)local_218[8];
          local_1e8[5] = (tcu)local_218[9];
          local_1e8[6] = (tcu)local_218[10];
          local_1e8[7] = (tcu)local_218[0xb];
          local_1e0 = (float)local_218._12_4_;
          local_290.m_data[0] = 0.0;
          local_290.m_data[1] = 0.0;
          local_288 = 0;
          lVar5 = 0;
          do {
            local_290.m_data[lVar5] =
                 *(float *)((long)&local_268 + lVar5 * 4) - *(float *)(local_1e8 + lVar5 * 4);
            lVar5 = lVar5 + 1;
          } while (lVar5 != 3);
          local_270 = 0;
          local_278 = 0;
          lVar5 = 0;
          do {
            fVar11 = local_290.m_data[lVar5];
            fVar16 = -fVar11;
            if (-fVar11 <= fVar11) {
              fVar16 = fVar11;
            }
            *(float *)((long)&local_278 + lVar5 * 4) = fVar16;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 3);
          local_2b8.m_data = local_2b8.m_data & 0xffffffffff000000;
          lVar5 = 0;
          do {
            *(bool *)((long)local_2b8.m_data + lVar5) =
                 *(float *)((long)&local_278 + lVar5 * 4) <= nonShadowThreshold->m_data[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 3);
          if (((local_2b8.m_data[0]._0_1_ == '\0') || (local_2b8.m_data[0]._1_1_ == '\0')) ||
             (local_2b8.m_data[0]._2_1_ == '\0')) {
            local_290.m_data[0] = -1.7014636e+38;
            tcu::RGBA::toVec((RGBA *)&local_290);
            tcu::PixelBufferAccess::setPixel(local_220,(Vec4 *)&local_278,iVar8,local_2bc,0);
            local_2a8 = (ulong)((int)local_2a8 + 1);
          }
          else if (((float)local_218._0_4_ != (float)local_1c8._0_4_) ||
                  (NAN((float)local_218._0_4_) || NAN((float)local_1c8._0_4_))) {
            fVar11 = (float)iVar8 + 0.5;
            fVar16 = fVar11 / local_2ac;
            bVar4 = 1.0 <= (float)local_108._0_4_ + fVar16;
            if (bVar4) {
              local_294 = local_2ac - fVar11;
              local_298 = local_25c;
            }
            else {
              local_298 = local_2b0;
              local_294 = fVar11;
            }
            lVar5 = (ulong)((uint)bVar4 * 4) * 3;
            fVar12 = *(float *)((long)local_238 + lVar5);
            fVar14 = *(float *)((long)local_238 + lVar5 + 4);
            fVar15 = *(float *)((long)local_238 + lVar5 + 8);
            uVar2 = *(ulong *)((long)&local_128 + lVar5);
            fVar42 = (float)uVar2;
            fStack_a4 = (float)(uVar2 >> 0x20);
            auVar29._8_8_ = 0;
            auVar29._0_8_ = *(ulong *)((long)afStack_120 + lVar5 + -4);
            uVar37 = (int)((uint)bVar4 << 0x1f) >> 0x1f;
            uVar40 = (int)((uint)bVar4 << 0x1f) >> 0x1f;
            auVar17._0_4_ = local_e8._0_4_ & uVar37;
            auVar17._4_4_ = (uint)(1.0 - fVar16) & uVar40;
            auVar17._8_8_ = 0;
            auVar39._0_4_ = ~uVar37 & local_108._0_4_;
            auVar39._4_4_ = ~uVar40 & (uint)fVar16;
            auVar39._8_4_ = local_108._8_4_;
            auVar39._12_4_ = local_108._12_4_;
            auVar39 = auVar39 | auVar17;
            fVar38 = auVar39._0_4_;
            fVar41 = auVar39._4_4_;
            fVar24 = auVar39._8_4_;
            fVar13 = auVar39._12_4_;
            fVar23 = (1.0 - fVar41) - fVar38;
            auVar18 = divps(auVar39,auVar29);
            auVar19._4_4_ = auVar18._4_4_;
            auVar19._0_4_ = auVar19._4_4_;
            auVar19._8_4_ = auVar19._4_4_;
            auVar19._12_4_ = auVar19._4_4_;
            auVar20._4_12_ = auVar19._4_12_;
            auVar20._0_4_ = auVar19._4_4_ + fVar23 / fVar42 + auVar18._0_4_;
            fVar43 = (float)*(undefined8 *)(local_218 + lVar5 + 0x14);
            fVar36 = (float)((ulong)*(undefined8 *)(local_218 + lVar5 + 0x14) >> 0x20);
            auVar33._0_4_ = fVar43 * fVar38;
            auVar33._4_4_ = fVar12 * fVar23;
            auVar33._8_4_ = fVar24 * 0.0;
            auVar33._12_4_ = fVar13 * 0.0;
            fVar16 = *(float *)(local_218 + lVar5 + 0x10);
            auVar30._0_4_ = fVar16 * fVar23;
            auVar30._4_4_ = fVar14 * fVar38;
            auVar30._8_4_ = fVar24 * 0.0;
            auVar30._12_4_ = fVar13 * 0.0;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = uVar2;
            auVar31 = divps(auVar30,auVar31);
            auVar18._4_4_ = fVar42;
            auVar18._0_4_ = fStack_a4;
            auVar18._8_8_ = 0;
            auVar18 = divps(auVar33,auVar18);
            auVar32._0_4_ = fVar36 * fVar41;
            auVar32._4_4_ = fVar15 * fVar41;
            auVar32._8_4_ = fVar36 * fVar41;
            auVar32._12_4_ = fVar36 * fVar41;
            fVar23 = *(float *)((long)afStack_120 + lVar5);
            auVar10._4_4_ = fVar23;
            auVar10._0_4_ = fVar23;
            auVar10._8_8_ = 0;
            auVar33 = divps(auVar32,auVar10);
            auVar34._0_4_ = auVar33._0_4_ + auVar31._0_4_ + auVar18._0_4_;
            auVar34._4_4_ = auVar33._4_4_ + auVar31._4_4_ + auVar18._4_4_;
            auVar34._8_4_ = auVar33._8_4_ + auVar31._8_4_ + auVar18._8_4_;
            auVar34._12_4_ = auVar33._12_4_ + auVar31._12_4_ + auVar18._12_4_;
            auVar22._0_8_ = auVar20._0_8_;
            auVar22._8_4_ = auVar19._4_4_;
            auVar22._12_4_ = auVar19._4_4_;
            auVar21._8_8_ = auVar22._8_8_;
            auVar21._4_4_ = auVar20._0_4_;
            auVar21._0_4_ = auVar20._0_4_;
            auVar18 = divps(auVar34,auVar21);
            local_290.m_data = auVar18._0_8_;
            fVar9 = fVar38 + -1.0;
            local_78 = ZEXT416((uint)(fVar23 * local_2ac));
            local_198 = fVar23 * local_2ac * fVar38 + fVar11 * fStack_a4;
            fStack_194 = (fVar43 - fVar16) * fVar23 + (fVar36 - fVar43) * fVar42;
            fStack_190 = fVar24 * 0.0 + 0.0;
            fStack_18c = fVar36 * fVar13 + fVar36 * 0.0;
            local_88 = -fVar42;
            fStack_84 = -fStack_a4;
            local_188 = fVar23 * fStack_a4;
            fStack_184 = (fVar16 - fVar36) * fStack_a4;
            fStack_180 = fStack_a4 * 0.0;
            fStack_17c = fStack_a4 * 0.0;
            uStack_80 = 0x80000000;
            uStack_7c = 0x80000000;
            fVar24 = (local_2ac * fVar9 + fVar11) * local_188 + local_88 * local_198;
            local_a8 = fStack_a4 * fVar28;
            fVar11 = fVar42 * fStack_a4 * fVar23;
            local_c8._0_4_ = fVar11 * local_2ac;
            local_c8._4_4_ = fStack_a4;
            local_c8._8_8_ = 0;
            fVar24 = fVar24 * fVar24;
            fVar25 = (fVar14 - fVar12) * fVar23 + (fVar15 - fVar14) * fVar42;
            fVar26 = (fVar12 - fVar15) * fStack_a4;
            local_168 = ZEXT416((uint)fVar25);
            local_158 = ZEXT416((uint)fVar26);
            fVar13 = fVar41 + -1.0;
            fVar27 = (fVar28 * fVar13 + local_2b0) * local_188 -
                     (local_a8 * fVar41 + local_2b0 * fVar23) * fVar42;
            fVar35 = (fVar43 - fVar36) * fVar42 + (fVar36 - fVar16) * fStack_a4;
            fVar43 = (fVar16 - fVar43) * fVar23;
            local_68 = CONCAT44(fVar36,fVar35);
            uStack_60 = 0;
            local_b8 = ZEXT416((uint)fVar43);
            fVar16 = (fVar14 - fVar15) * fVar42 + (fVar15 - fVar12) * fStack_a4;
            local_1a8 = ZEXT416((uint)fVar23);
            fVar23 = (fVar12 - fVar14) * fVar23;
            local_248 = ZEXT416((uint)fVar16);
            local_178 = ZEXT416((uint)fVar23);
            local_1c8._16_4_ = fVar11 * fVar28;
            local_1c8._20_8_ = uVar2 >> 0x20;
            local_1c8._28_4_ = 0;
            fVar27 = fVar27 * fVar27;
            fStack_a0 = fStack_a4;
            fStack_9c = fStack_a4;
            local_98 = fStack_a4;
            fStack_94 = fStack_a4;
            fStack_90 = fStack_a4;
            fStack_8c = fStack_a4;
            tcu::computeLodBoundsFromDerivates
                      ((tcu *)&local_268,
                       (((float)local_c8._0_4_ * (fVar9 * fStack_184 + fVar38 * fStack_194)) /
                       fVar24) * local_258,
                       (((fVar9 * fVar26 + fVar38 * fVar25) * (float)local_c8._0_4_) / fVar24) *
                       (float)local_f8._0_4_,
                       (((fVar43 * fVar13 + fVar41 * fVar35) * (float)local_1c8._16_4_) / fVar27) *
                       local_258,
                       (((fVar13 * fVar23 + fVar41 * fVar16) * (float)local_1c8._16_4_) / fVar27) *
                       (float)local_f8._0_4_,lodPrec);
            local_d8 = fStack_184;
            fStack_d4 = fStack_184;
            fStack_d0 = fStack_184;
            fStack_cc = fStack_184;
            local_198 = fStack_194;
            fStack_190 = fStack_194;
            fStack_18c = fStack_194;
            lVar5 = 0;
            do {
              fVar11 = local_58[lVar5 * 2] + local_294;
              fVar12 = local_58[lVar5 * 2 + 1] + local_298;
              fVar15 = fVar11 / local_2ac;
              fVar23 = fVar12 / fVar28;
              fVar16 = fVar23 + -1.0;
              fVar11 = (local_2ac * fVar16 + fVar11) * local_188 +
                       ((float)local_78._0_4_ * fVar23 + fVar11 * local_98) * local_88;
              fVar11 = fVar11 * fVar11;
              fVar14 = fVar15 + -1.0;
              fVar12 = (fVar28 * fVar14 + fVar12) * local_188 +
                       (local_a8 * fVar15 + fVar12 * (float)local_1a8._0_4_) * local_88;
              fVar12 = fVar12 * fVar12;
              tcu::computeLodBoundsFromDerivates
                        ((tcu *)&local_278,
                         (((local_d8 * fVar16 + local_198 * fVar23) * (float)local_c8._0_4_) /
                         fVar11) * local_258,
                         (((fVar16 * (float)local_158._0_4_ + fVar23 * (float)local_168._0_4_) *
                          (float)local_c8._0_4_) / fVar11) * (float)local_f8._0_4_,
                         ((((float)local_b8._0_4_ * fVar14 + (float)local_68 * fVar15) *
                          (float)local_1c8._16_4_) / fVar12) * local_258,
                         (((fVar14 * (float)local_178._0_4_ + fVar15 * (float)local_248._0_4_) *
                          (float)local_1c8._16_4_) / fVar12) * (float)local_f8._0_4_,lodPrec);
              pRVar3 = local_280;
              fVar16 = (float)((ulong)local_278 >> 0x20);
              fVar11 = (float)(local_268 >> 0x20);
              uVar37 = -(uint)((float)local_268 <= (float)local_278);
              uVar40 = -(uint)(fVar16 <= fVar11);
              local_268 = CONCAT44(~uVar40 & (uint)fVar16,~uVar37 & (uint)(float)local_278) |
                          CONCAT44((uint)fVar11 & uVar40,(uint)(float)local_268 & uVar37);
              lVar5 = lVar5 + 1;
            } while (lVar5 != 4);
            local_278 = CONCAT44((float)(local_268 >> 0x20) + (float)local_1d8._4_4_,
                                 (float)local_268 + (float)local_1d8._0_4_);
            local_2b8.m_data[0] = local_280->minLod;
            local_2b8.m_data[1] = local_280->maxLod;
            tcu::clampLodBounds(local_1e8,(Vec2 *)&local_278,&local_2b8,lodPrec);
            bVar4 = tcu::isTexCompareResultValid
                              (local_138,local_140,comparePrec,&local_290,(Vec2 *)local_1e8,
                               (pRVar3->super_RenderParams).ref,(float)local_218._0_4_);
            if (!bVar4) {
              local_2b8.m_data[0] = -1.7014636e+38;
              tcu::RGBA::toVec((RGBA *)&local_2b8);
              tcu::PixelBufferAccess::setPixel(local_220,(Vec4 *)&local_278,iVar8,local_2bc,0);
              local_2a8 = (ulong)((int)local_2a8 + 1);
            }
          }
          iVar8 = iVar8 + 1;
          iVar6 = (local_2a0->m_size).m_data[0];
          pCVar7 = local_2a0;
        } while (iVar8 < iVar6);
        iVar8 = (local_2a0->m_size).m_data[1];
      }
      local_2bc = local_2bc + 1;
    } while (local_2bc < iVar8);
  }
  return (int)local_2a8;
}

Assistant:

int computeTextureCompareDiff (const tcu::ConstPixelBufferAccess&	result,
							   const tcu::ConstPixelBufferAccess&	reference,
							   const tcu::PixelBufferAccess&		errorMask,
							   const tcu::Texture2DView&			src,
							   const float*							texCoord,
							   const ReferenceParams&				sampleParams,
							   const tcu::TexComparePrecision&		comparePrec,
							   const tcu::LodPrecision&				lodPrec,
							   const tcu::Vec3&						nonShadowThreshold)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	const tcu::Vec4		sq				= tcu::Vec4(texCoord[0+0], texCoord[2+0], texCoord[4+0], texCoord[6+0]);
	const tcu::Vec4		tq				= tcu::Vec4(texCoord[0+1], texCoord[2+1], texCoord[4+1], texCoord[6+1]);

	const tcu::IVec2	dstSize			= tcu::IVec2(result.getWidth(), result.getHeight());
	const float			dstW			= float(dstSize.x());
	const float			dstH			= float(dstSize.y());
	const tcu::IVec2	srcSize			= tcu::IVec2(src.getWidth(), src.getHeight());

	// Coordinates and lod per triangle.
	const tcu::Vec3		triS[2]			= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3		triT[2]			= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3		triW[2]			= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2		lodBias			((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int					numFailed		= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= result.getPixel(px, py);
			const tcu::Vec4	refPix	= reference.getPixel(px, py);

			// Other channels should trivially match to reference.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(refPix.swizzle(1,2,3) - resPix.swizzle(1,2,3)), nonShadowThreshold)))
			{
				errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
				numFailed += 1;
				continue;
			}

			// Reference result is known to be a valid result, we can
			// skip verification if thes results are equal
			if (resPix.x() != refPix.x())
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec2	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec2	coordDx		= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
														triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize.asFloat();
				const tcu::Vec2	coordDy		= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
														triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize.asFloat();

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDy.x(), coordDy.y(), lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec2	coordDxo	= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
															triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize.asFloat();
					const tcu::Vec2	coordDyo	= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
															triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize.asFloat();
					const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDyo.x(), coordDyo.y(), lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isTexCompareResultValid(src, sampleParams.sampler, comparePrec, coord, clampedLod, sampleParams.ref, resPix.x());

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}